

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xdg_utils.hpp
# Opt level: O2

string * xdg_utils::data::home_abi_cxx11_(void)

{
  string *in_RDI;
  allocator<char> local_71;
  string local_70;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"",(allocator<char> *)&local_50);
  env::get(in_RDI,(string *)XDG_DATA_HOME_abi_cxx11_,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  if ((in_RDI->_M_string_length == 0) || (*(in_RDI->_M_dataplus)._M_p != '/')) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"HOME",&local_71);
    env::get(&local_50,&local_30);
    std::operator+(&local_70,&local_50,"/.local/share");
    std::__cxx11::string::operator=((string *)in_RDI,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
    if (in_RDI->_M_string_length == 0) goto LAB_0011cf2f;
  }
  if (*(in_RDI->_M_dataplus)._M_p == '/') {
    return in_RDI;
  }
LAB_0011cf2f:
  std::__cxx11::string::assign((char *)in_RDI,0);
  return in_RDI;
}

Assistant:

std::string home() {
  auto path = env::get(XDG_DATA_HOME, "");

  if (!is_absolute_path(path)) {
    path = env::get(HOME) + XDG_DATA_HOME_SUFFIX;
  }

  if (!is_absolute_path(path))
    path = {};

  return path;
}